

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  byte bVar1;
  ushort uVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  DecodeStatus extraout_EAX;
  MCOperand *pMVar6;
  byte bVar7;
  ulong uVar8;
  MCOperandInfo *m;
  ulong Val;
  
  uVar4 = MCInst_getOpcode(MI);
  if ((int)uVar4 < 0xa51) {
    if ((uVar4 - 0x90f < 3) || ((uVar4 != 0x8fc && (uVar4 == 0x904)))) goto LAB_00148ecd;
LAB_00148eff:
    uVar4 = (ud->ITBlock).size;
    if (uVar4 == 0) {
      Val = 0xe;
      goto LAB_00148f2e;
    }
  }
  else {
    if ((0x34 < uVar4 - 0xa98) || ((0x1000100000010dU >> ((ulong)(uVar4 - 0xa98) & 0x3f) & 1) == 0))
    goto LAB_00148eff;
LAB_00148ecd:
    uVar4 = (ud->ITBlock).size;
    if (uVar4 == 0) {
      return MCDisassembler_Fail;
    }
  }
  bVar1 = (ud->ITBlock).ITStates[uVar4 - 1];
  bVar7 = 0xe;
  if (bVar1 != 0xf) {
    bVar7 = bVar1;
  }
  Val = (ulong)bVar7;
  (ud->ITBlock).size = uVar4 - 1;
LAB_00148f2e:
  uVar4 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(MI);
  uVar2 = ARMInsts[uVar4].NumOperands;
  uVar4 = (uint)uVar2;
  if (uVar2 == 0) {
    uVar4 = 0;
  }
  else {
    uVar8 = 0;
    do {
      uVar5 = MCInst_getNumOperands(MI);
      if ((uVar8 == uVar5) || (_Var3 = MCOperandInfo_isPredicate(m), _Var3)) {
        uVar4 = (uint)uVar8;
        break;
      }
      uVar8 = uVar8 + 1;
      m = m + 1;
    } while (uVar2 != uVar8);
  }
  pMVar6 = MCOperand_CreateImm1(MI,Val);
  MCInst_insert0(MI,uVar4,pMVar6);
  pMVar6 = MCOperand_CreateReg1(MI,(uint)((int)Val != 0xe) * 3);
  MCInst_insert0(MI,uVar4 + 1,pMVar6);
  return extraout_EAX;
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}